

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignedsuperblockheap.h
# Opt level: O1

void * __thiscall
Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>::malloc
          (SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource> *this,size_t __size)

{
  DLList *pDVar1;
  AlignedMmapInstance<262144UL> AVar2;
  Entry *pEVar3;
  AlignedMmapInstance<262144UL> *this_00;
  Entry *pEVar4;
  lock_guard<HL::SpinLockType> l;
  
  pDVar1 = &this->_freeSuperblocks;
  if ((this->_freeSuperblocks).head.next == &pDVar1->head) {
    if (HL::ExactlyOne<HL::LockedHeap<HL::SpinLockType,Hoard::AlignedMmapInstance<262144ul>>>::
        operator()()::theOneTrueInstancePtr == '\0') {
      SuperblockStore<262144ul,HL::SpinLockType,Hoard::MmapSource>::malloc();
    }
    this_00 = HL::ExactlyOne<HL::LockedHeap<HL::SpinLockType,Hoard::AlignedMmapInstance<262144ul>>>
              ::operator()()::theOneTrueInstancePtr;
    LOCK();
    AVar2 = *HL::ExactlyOne<HL::LockedHeap<HL::SpinLockType,Hoard::AlignedMmapInstance<262144ul>>>::
             operator()()::theOneTrueInstancePtr;
    *HL::ExactlyOne<HL::LockedHeap<HL::SpinLockType,Hoard::AlignedMmapInstance<262144ul>>>::
     operator()()::theOneTrueInstancePtr = (AlignedMmapInstance<262144UL>)0x1;
    UNLOCK();
    if (((byte)AVar2 & 1) != 0) {
      HL::SpinLockType::contendedLock((SpinLockType *)this_00);
    }
    pEVar4 = (Entry *)mmap((void *)0x0,0x40000,3,0x22,-1,0);
    if (pEVar4 == (Entry *)0xffffffffffffffff) {
      pEVar4 = (Entry *)0x0;
    }
    if ((Entry *)((ulong)((long)&pEVar4[0x3fff].next + 7U) & 0xfffffffffffc0000) != pEVar4) {
      munmap(pEVar4,0x40000);
      pEVar4 = (Entry *)AlignedMmapInstance<262144UL>::slowMap(this_00,0x40000);
    }
    LOCK();
    *this_00 = (AlignedMmapInstance<262144UL>)0x0;
    UNLOCK();
    if (pEVar4 == (Entry *)0x0) {
      return (void *)0x0;
    }
    pEVar3 = (this->_freeSuperblocks).head.next;
    pEVar4->prev = &pDVar1->head;
    pEVar4->next = pEVar3;
    (this->_freeSuperblocks).head.next = pEVar4;
    pEVar3->prev = pEVar4;
  }
  pEVar4 = (this->_freeSuperblocks).head.next;
  if (pEVar4 == &pDVar1->head) {
    pEVar4 = (Entry *)0x0;
  }
  else {
    pEVar3 = pEVar4->next;
    (this->_freeSuperblocks).head.next = pEVar3;
    pEVar3->prev = &pDVar1->head;
  }
  return pEVar4;
}

Assistant:

void * malloc (size_t) {
      if (_freeSuperblocks.isEmpty()) {
	// Get more memory.
	void * ptr = _superblockSource.malloc (ChunksToGrab * SuperblockSize);
	if (!ptr) {
	  return nullptr;
	}
	char * p = (char *) ptr;
	for (int i = 0; i < ChunksToGrab; i++) {
	  _freeSuperblocks.insert ((DLList::Entry *) p);
	  p += SuperblockSize;
	}
      }
      return _freeSuperblocks.get();
    }